

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O2

int __thiscall LibGens::Ym2612::reInit(Ym2612 *this,int clock,int rate)

{
  int iVar1;
  Ym2612Private *pYVar2;
  uint *puVar3;
  int i;
  uint uVar4;
  long lVar5;
  uint (*pauVar6) [32];
  ulong uVar7;
  undefined1 *puVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  if (rate < 1) {
    __assert_fail("rate > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/gens/Ym2612.cpp"
                  ,0x605,"int LibGens::Ym2612::reInit(int, int)");
  }
  if (rate < clock) {
    memset(&this->d->state,0,0x11b8);
    pYVar2 = this->d;
    (pYVar2->state).Clock = clock;
    (pYVar2->state).Rate = rate;
    dVar10 = ((double)clock / (double)rate) / 144.0;
    (pYVar2->state).Frequence = dVar10;
    (pYVar2->state).TimerBase = (int)(dVar10 * 4096.0);
    uVar4 = 0x4000;
    if ((this->m_improved == true) && (1.0 < dVar10)) {
      uVar4 = (uint)(long)((1.0 / dVar10) * 16384.0);
      (pYVar2->state).Rate = (int)((double)clock / 144.0);
      (pYVar2->state).Frequence = 1.0;
      dVar10 = 1.0;
    }
    (pYVar2->state).Inter_Step = uVar4;
    (pYVar2->state).Inter_Cnt = 0;
    for (lVar5 = 0; lVar5 != 0x800; lVar5 = lVar5 + 1) {
      pYVar2->FINC_TAB[lVar5] = (uint)(long)((double)(int)lVar5 * dVar10 * 4096.0 * 0.5);
    }
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      pYVar2->AR_TAB[lVar5] = 0;
      pYVar2->DR_TAB[lVar5] = 0;
    }
    for (uVar7 = 0; uVar7 != 0x3c; uVar7 = uVar7 + 1) {
      dVar11 = (double)(1 << ((byte)(uVar7 >> 2) & 0x1f)) *
               ((double)((uint)uVar7 & 3) * 0.25 + 1.0) * dVar10 * 268435456.0;
      pYVar2->AR_TAB[uVar7 + 4] = (uint)(long)(dVar11 / 399128.0);
      pYVar2->DR_TAB[uVar7 + 4] = (uint)(long)(dVar11 / 5514396.0);
    }
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
      pYVar2->AR_TAB[lVar5 + 0x40] = pYVar2->AR_TAB[0x3f];
      *(uint *)((long)(pYVar2->DT_TAB + -1) + lVar5 * 4) = pYVar2->DR_TAB[0x3f];
    }
    pauVar6 = pYVar2->DT_TAB + 4;
    puVar8 = &Ym2612Private::DT_DEF_TAB;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
        dVar11 = (double)(byte)puVar8[lVar9] * dVar10 * 32.0;
        pauVar6[-4][lVar9] = (int)dVar11;
        (*pauVar6)[lVar9] = (int)-dVar11;
      }
      puVar8 = puVar8 + 0x20;
      pauVar6 = pauVar6 + 1;
    }
    uVar4 = (pYVar2->state).Inter_Step;
    iVar1 = (pYVar2->state).Rate;
    puVar3 = pYVar2->LFO_INC_TAB;
    for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 8) {
      *puVar3 = (uint)(long)((*(double *)((long)reInit::LFO_BITS + lVar5) * 268435456.0) /
                            (double)(uVar4 * iVar1 >> 0xe));
      puVar3 = puVar3 + 1;
    }
    reset(this);
    return 0;
  }
  __assert_fail("clock > rate",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/gens/Ym2612.cpp"
                ,0x606,"int LibGens::Ym2612::reInit(int, int)");
}

Assistant:

int Ym2612::reInit(int clock, int rate)
{
	assert(rate > 0);
	assert(clock > rate);
	if (rate <= 0 || clock <= rate)
		return -1;

	// Clear the state struct.
	memset(&d->state, 0, sizeof(d->state));
	d->state.Clock = clock;
	d->state.Rate = rate;

	// 144 = 12 * (prescale * 2) = 12 * 6 * 2
	// prescale set to 6 by default

	d->state.Frequence = ((double)(d->state.Clock) / (double)(d->state.Rate)) / 144.0;
	d->state.TimerBase = (int)(d->state.Frequence * 4096.0);

	if (m_improved && (d->state.Frequence > 1.0)) {
		d->state.Inter_Step = (unsigned int)((1.0 / d->state.Frequence) * (double)(0x4000));
		d->state.Inter_Cnt = 0;

		// We recalculate rate and frequence after interpolation
		d->state.Rate = (int)(d->state.Clock / 144.0);
		d->state.Frequence = 1.0;
	} else {
		// No interpolation.
		d->state.Inter_Step = 0x4000;
		d->state.Inter_Cnt = 0;
	}

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG2,
//		"YM2612 frequency = %g, rate = %d, interp step = %.8X",
//		d->state.Frequence, d->state.Rate, d->state.Inter_Step);

	// Frequency Step table.
	for (int i = 0; i < 2048; i++) {
		double x = (double)(i) * d->state.Frequence;
		#if ((SIN_LBITS + SIN_HBITS - (21 - 7)) < 0)
			x /= (double) (1 << ((21 - 7) - SIN_LBITS - SIN_HBITS));
		#else
			x *= (double) (1 << (SIN_LBITS + SIN_HBITS - (21 - 7)));
		#endif
		x /= 2.0;			// because MUL = value * 2
		d->FINC_TAB[i] = (unsigned int)x;
	}

	// Attack and Decay Rate tables.
	// Entries 0-3 are always 0.
	for (int i = 0; i < 4; i++) {
		d->AR_TAB[i] = 0;
		d->DR_TAB[i] = 0;
	}

	// Attack and Decay Rate tables.
	// Calculate entries 32-63.
	for (int i = 0; i < 60; i++) {
		double x = d->state.Frequence;

		x *= 1.0 + ((i & 3) * 0.25);		 // bits 0-1 : x1.00, x1.25, x1.50, x1.75
		x *= (double) (1 << ((i >> 2)));	 // bits 2-5 : shift bits (x2^0 - x2^15)
		x *= (double) (d->ENV_LENGTH << ENV_LBITS); // on ajuste pour le tableau ENV_TAB

		d->AR_TAB[i + 4] = (unsigned int) (x / d->AR_RATE);
		d->DR_TAB[i + 4] = (unsigned int) (x / d->DR_RATE);
	}

	// Attack and Decay Rate tables.
	// Entries 64-95 are copies of entry 63.
	for (int i = 64; i < 96; i++) {
		d->AR_TAB[i] = d->AR_TAB[63];
		d->DR_TAB[i] = d->DR_TAB[63];
	}

	// Detune table.
	for (int i = 0; i < 4; i++) {
		for (int j = 0; j < 32; j++) {
			double x;
			#if ((SIN_LBITS + SIN_HBITS - 21) < 0)
				x = (double)d->DT_DEF_TAB[i][j] * d->state.Frequence /
				    (double)(1 << (21 - SIN_LBITS - SIN_HBITS));
			#else
				x = (double)d->DT_DEF_TAB[i][j] * d->state.Frequence *
				    (double)(1 << (SIN_LBITS + SIN_HBITS - 21));
			#endif

			d->DT_TAB[i + 0][j] = (int) x;
			d->DT_TAB[i + 4][j] = (int) -x;
		}
	}

	// LFO step table.
	// TODO: Move to a static class variable?
	static const double LFO_BITS[8] = {
		3.98, 5.56, 6.02, 6.37, 6.88, 9.63, 48.1, 72.2
	};

	double j = (d->state.Rate * d->state.Inter_Step) / 0x4000;
	for (int i = 0; i < 8; i++) {
		d->LFO_INC_TAB[i] = (unsigned int) (LFO_BITS[i] * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
	}


	// Reset the YM2612.
	reset();
	return 0;
}